

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.h
# Opt level: O2

int __thiscall glslang::TInputScanner::peek(TInputScanner *this)

{
  long lVar1;
  size_t sVar2;
  
  lVar1 = (long)this->currentSource;
  if (this->numSources <= this->currentSource) {
    this->endOfFileReached = true;
    return -1;
  }
  sVar2 = this->currentChar;
  do {
    if (sVar2 < this->lengths[lVar1]) {
      return (int)this->sources[lVar1][sVar2];
    }
    lVar1 = lVar1 + 1;
    sVar2 = 0;
  } while (lVar1 < this->numSources);
  return -1;
}

Assistant:

int peek()
    {
        if (currentSource >= numSources) {
            endOfFileReached = true;
            return EndOfInput;
        }
        // Make sure we do not read off the end of a string.
        // N.B. Sources can have a length of 0.
        int sourceToRead = currentSource;
        size_t charToRead = currentChar;
        while(charToRead >= lengths[sourceToRead]) {
            charToRead = 0;
            sourceToRead += 1;
            if (sourceToRead >= numSources) {
                return EndOfInput;
            }
        }

        // Here, we care about making negative valued characters positive
        return sources[sourceToRead][charToRead];
    }